

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gate.c
# Opt level: O1

int gate_segment_mix(mixed_segment *segment)

{
  float fVar1;
  undefined8 *puVar2;
  mixed_buffer *buffer;
  mixed_buffer *buffer_00;
  ulong uVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  undefined1 auVar8 [64];
  uint32_t samples;
  float *out;
  float *in;
  uint32_t local_4c;
  float local_48;
  uint local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float *local_30;
  float *local_28;
  
  puVar2 = (undefined8 *)segment->data;
  local_34 = (float)(1.0 / (double)*(uint *)((long)puVar2 + 0x24));
  uVar7 = *(uint *)(puVar2 + 5);
  local_38 = *(float *)(puVar2 + 2);
  local_3c = *(float *)((long)puVar2 + 0x14);
  local_40 = *(float *)(puVar2 + 3);
  local_44 = *(uint *)((long)puVar2 + 0x1c);
  local_48 = *(float *)(puVar2 + 4);
  local_4c = 0xffffffff;
  buffer = (mixed_buffer *)*puVar2;
  buffer_00 = (mixed_buffer *)puVar2[1];
  mixed_buffer_request_read(&local_28,&local_4c,buffer);
  if (buffer == buffer_00) {
    if ((ulong)local_4c != 0) {
      uVar4 = *(undefined4 *)((long)puVar2 + 0x2c);
      fVar5 = 1.0;
      uVar3 = 0;
      auVar8 = ZEXT464(uVar7);
      do {
        fVar1 = local_28[uVar3];
        fVar6 = auVar8._0_4_;
        switch(uVar4) {
        case 1:
          fVar5 = 0.0;
          if (local_3c <= fVar1) {
            *(undefined4 *)((long)puVar2 + 0x2c) = 2;
            uVar4 = 2;
LAB_0013dea7:
            fVar5 = 0.0;
            auVar8 = ZEXT1664(ZEXT816(0) << 0x40);
          }
          break;
        case 2:
          if (fVar6 <= local_40) {
            fVar5 = fVar6 / local_40;
            auVar8 = ZEXT464((uint)(fVar6 + local_34));
          }
          else {
LAB_0013de62:
            *(undefined4 *)((long)puVar2 + 0x2c) = 3;
            uVar4 = 3;
          }
          break;
        case 3:
          if (fVar1 < local_38) {
            *(undefined4 *)((long)puVar2 + 0x2c) = 4;
            uVar4 = 4;
            auVar8 = ZEXT464(local_44);
          }
          break;
        case 4:
          if (local_3c <= fVar1) goto LAB_0013de62;
          if (fVar6 <= 0.0) {
            *(undefined4 *)((long)puVar2 + 0x2c) = 5;
            uVar4 = 5;
            auVar8 = ZEXT464((uint)local_48);
          }
          else {
LAB_0013de56:
            auVar8 = ZEXT464((uint)(fVar6 - local_34));
          }
          break;
        case 5:
          if (fVar1 < local_3c) {
            if (0.0 < fVar6) {
              fVar5 = fVar6 / local_48;
              goto LAB_0013de56;
            }
            *(undefined4 *)((long)puVar2 + 0x2c) = 1;
            uVar4 = 1;
            goto LAB_0013dea7;
          }
          fVar5 = fVar6 / local_48;
          auVar8 = ZEXT464((uint)(local_40 * fVar5));
          *(undefined4 *)((long)puVar2 + 0x2c) = 2;
          uVar4 = 2;
        }
        uVar7 = auVar8._0_4_;
        local_28[uVar3] = fVar1 * fVar5;
        uVar3 = uVar3 + 1;
      } while (local_4c != uVar3);
    }
  }
  else {
    mixed_buffer_request_write(&local_30,&local_4c,buffer_00);
    if ((ulong)local_4c != 0) {
      uVar4 = *(undefined4 *)((long)puVar2 + 0x2c);
      fVar5 = 1.0;
      uVar3 = 0;
      auVar8 = ZEXT464(uVar7);
      do {
        fVar1 = local_28[uVar3];
        fVar6 = auVar8._0_4_;
        switch(uVar4) {
        case 1:
          fVar5 = 0.0;
          if (local_3c <= fVar1) {
            *(undefined4 *)((long)puVar2 + 0x2c) = 2;
            uVar4 = 2;
LAB_0013dd49:
            fVar5 = 0.0;
            auVar8 = ZEXT1664(ZEXT816(0) << 0x40);
          }
          break;
        case 2:
          if (fVar6 <= local_40) {
            fVar5 = fVar6 / local_40;
            auVar8 = ZEXT464((uint)(fVar6 + local_34));
          }
          else {
LAB_0013dd01:
            *(undefined4 *)((long)puVar2 + 0x2c) = 3;
            uVar4 = 3;
          }
          break;
        case 3:
          if (fVar1 < local_38) {
            *(undefined4 *)((long)puVar2 + 0x2c) = 4;
            uVar4 = 4;
            auVar8 = ZEXT464(local_44);
          }
          break;
        case 4:
          if (local_3c <= fVar1) goto LAB_0013dd01;
          if (fVar6 <= 0.0) {
            *(undefined4 *)((long)puVar2 + 0x2c) = 5;
            uVar4 = 5;
            auVar8 = ZEXT464((uint)local_48);
          }
          else {
LAB_0013dcf5:
            auVar8 = ZEXT464((uint)(fVar6 - local_34));
          }
          break;
        case 5:
          if (fVar1 < local_3c) {
            if (0.0 < fVar6) {
              fVar5 = fVar6 / local_48;
              goto LAB_0013dcf5;
            }
            *(undefined4 *)((long)puVar2 + 0x2c) = 1;
            uVar4 = 1;
            goto LAB_0013dd49;
          }
          fVar5 = fVar6 / local_48;
          auVar8 = ZEXT464((uint)(local_40 * fVar5));
          *(undefined4 *)((long)puVar2 + 0x2c) = 2;
          uVar4 = 2;
        }
        uVar7 = auVar8._0_4_;
        local_30[uVar3] = fVar1 * fVar5;
        uVar3 = uVar3 + 1;
      } while (local_4c != uVar3);
    }
    mixed_buffer_finish_read(local_4c,buffer);
    mixed_buffer_finish_write(local_4c,buffer_00);
  }
  *(uint *)(puVar2 + 5) = uVar7;
  return 1;
}

Assistant:

VECTORIZE int gate_segment_mix(struct mixed_segment *segment){
  struct gate_segment_data *data = (struct gate_segment_data *)segment->data;

  float stime = 1.0/data->samplerate;
  float time = data->time;
  float open = data->open_threshold;
  float close = data->close_threshold;
  float attack = data->attack;
  float hold = data->hold;
  float release = data->release;
  float volume = 1.0;
  
  with_mixed_buffer_transfer(i, samples, in, data->in, out, data->out, {
      float sample = in[i];
      switch(data->state){
      case CLOSED:
        volume = 0.0;
        if(open <= sample){
          time = 0.0;
          data->state = ATTACKING;
        }
        break;
      case ATTACKING:
        if(attack < time){
          data->state = OPEN;
        }else{
          volume = time/attack;
          time += stime;
        }
        break;
      case OPEN:
        if(sample < close){
          time = hold;
          data->state = HOLDING;
        }
        break;
      case HOLDING:
        if(open <= sample){
          data->state = OPEN;
        }else if(time <= 0){
          time = release;
          data->state = RELEASING;
        }else{
          time -= stime;
        }
        break;
      case RELEASING:
        if(open <= sample){
          volume = time/release;
          time = time/release*attack;
          data->state = ATTACKING;
        }else if(time <= 0){
          volume = 0.0;
          time = 0.0;
          data->state = CLOSED;
        }else{
          volume = time/release;
          time -= stime;
        }
        break;
      }
      out[i] = sample * volume;
    })
  data->time = time;
  return 1;
}